

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O1

char * A64NamedImmMapper_toString(A64NamedImmMapper *N,uint32_t Value,_Bool *Valid)

{
  A64NamedImmMapper_Mapping *pAVar1;
  uint uVar2;
  ulong uVar3;
  
  if (N->NumPairs != 0) {
    pAVar1 = N->Pairs;
    uVar2 = 1;
    uVar3 = 0;
    do {
      if (pAVar1[uVar3].Value == Value) {
        *Valid = true;
        return pAVar1[uVar3].Name;
      }
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < N->NumPairs);
  }
  *Valid = false;
  return (char *)0x0;
}

Assistant:

char *A64NamedImmMapper_toString(A64NamedImmMapper *N, uint32_t Value, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (N->Pairs[i].Value == Value) {
			*Valid = true;
			return N->Pairs[i].Name;
		}
	}

	*Valid = false;
	return 0;
}